

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O1

void PatchImproveGoldRewardsHandling::handle_gold_rewards_for_npc
               (ROM *rom,uint32_t function_check_gold_reward)

{
  _func_int **pp_Var1;
  ROM *this;
  uint32_t uVar2;
  Code *code;
  Code proc_check_if_item_is_golds;
  Param local_138;
  undefined8 local_130;
  undefined1 local_128 [24];
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_110;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_e0;
  ROM *local_b0;
  Code local_a8;
  
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00261bb0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::clr(&local_a8,(Param *)local_128,LONG);
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200ff1196;
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_b0 = rom;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,WORD);
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x10000007f;
  md::Code::cmpi(&local_a8,(ImmediateValue *)local_128,&local_138,WORD);
  pp_Var1 = (_func_int **)(local_128 + 0x10);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_archipelago","");
  md::Code::bne(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x10000001e;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,WORD);
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200028ed2;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_archipelago","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x100000040;
  md::Code::cmpi(&local_a8,(ImmediateValue *)local_128,&local_138,WORD);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_golds","");
  md::Code::blt(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x100000040;
  md::Code::subi(&local_a8,(ImmediateValue *)local_128,&local_138,WORD);
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._12_4_ = 2;
  local_128._8_4_ = function_check_gold_reward;
  md::Code::jsr(&local_a8,(Param *)local_128);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR_getXn_00261bb0;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_130 = 0x200ff1878;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,LONG);
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200028ef0;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_golds","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x10000003f;
  md::Code::cmpi(&local_a8,(ImmediateValue *)local_128,&local_138,WORD);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_empty","");
  md::Code::bne(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_130 = local_130 & 0xffffffffffffff00;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261bb0;
  local_128._0_8_ = &PTR_getXn_00261c98;
  local_128._8_8_ = (pointer)0x10000001d;
  md::Code::move(&local_a8,(Param *)local_128,&local_138,WORD);
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200028ed2;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"item_not_empty","");
  md::Code::label(&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  local_128._0_8_ = &PTR_getXn_00261cd8;
  local_128._8_8_ = (pointer)0x200028eca;
  md::Code::jmp(&local_a8,(Param *)local_128);
  local_128._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"");
  this = local_b0;
  uVar2 = md::ROM::inject_code(local_b0,&local_a8,(string *)local_128);
  if ((_func_int **)local_128._0_8_ != pp_Var1) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_110._M_impl.super__Rb_tree_header._M_header;
  _Stack_e0._M_impl._0_8_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128._16_8_ = 0;
  _Stack_110._M_impl._0_8_ = 0;
  local_128._0_8_ = (_func_int **)0x0;
  local_128._8_8_ = (pointer)0x0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_e0._M_impl.super__Rb_tree_header._M_header;
  _Stack_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138._vptr_Param = (_func_int **)&PTR_getXn_00261cd8;
  local_130 = CONCAT44(2,uVar2);
  _Stack_110._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_110._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  code = md::Code::jmp((Code *)local_128,&local_138);
  md::ROM::set_code(this,0x28ec4,code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_e0);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_110);
  if ((_func_int **)local_128._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void handle_gold_rewards_for_npc(md::ROM& rom, uint32_t function_check_gold_reward)
    {
        constexpr uint32_t JUMP_ADDR_ITEM_REWARD = 0x28ECA;
        constexpr uint32_t JUMP_ADDR_GOLD_REWARD = 0x28EF0;
        constexpr uint32_t JUMP_ADDR_NO_REWARD = 0x28ED2;

        md::Code proc_check_if_item_is_golds;
        {
            proc_check_if_item_is_golds.clrl(reg_D0);
            proc_check_if_item_is_golds.movew(addr_(0xFF1196), reg_D0);
            proc_check_if_item_is_golds.cmpiw(ITEM_ARCHIPELAGO, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_archipelago");
            {
                // Archipelago item case
                proc_check_if_item_is_golds.movew(0x1E, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_archipelago");
            proc_check_if_item_is_golds.cmpiw(ITEM_GOLDS_START, reg_D0);
            proc_check_if_item_is_golds.blt("item_not_golds");
            {
                // Gold reward case
                proc_check_if_item_is_golds.subiw(ITEM_GOLDS_START, reg_D0);
                proc_check_if_item_is_golds.jsr(function_check_gold_reward);
                proc_check_if_item_is_golds.movel(reg_D0, addr_(0xFF1878));
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_GOLD_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_golds");
            proc_check_if_item_is_golds.cmpiw(ITEM_NONE, reg_D0);
            proc_check_if_item_is_golds.bne("item_not_empty");
            {
                // No item case
                proc_check_if_item_is_golds.movew(0x1D, reg_D0);
                proc_check_if_item_is_golds.jmp(JUMP_ADDR_NO_REWARD);
            }
            proc_check_if_item_is_golds.label("item_not_empty");
            // Item reward case
            proc_check_if_item_is_golds.jmp(JUMP_ADDR_ITEM_REWARD);
        }
        uint32_t addr = rom.inject_code(proc_check_if_item_is_golds);

        rom.set_code(0x28EC4, md::Code().jmp(addr));
    }